

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
gmlc::networking::extractInterfaceAndPort(string *address)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *in_RDI
  ;
  invalid_argument *anon_var_0;
  int val;
  size_type lastColon;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ret;
  undefined7 in_stack_fffffffffffffed8;
  char in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  
  __pos = in_RDI;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedf,0x714e2a);
  if (sVar2 == 0xffffffffffffffff) {
    std::make_pair<std::__cxx11::string_const&,int>
              (&in_RDI->first,(int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (type)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x714e86);
  }
  else {
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(in_RSI);
    if ((sVar2 + 1 < sVar3) &&
       (pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8)),
       *pvVar4 != '/')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffef8,(size_type)__pos,(size_type)in_RDI);
      iVar1 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (size_t *)
                                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffee0));
      iVar5 = iVar1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffef8,(size_type)__pos,(size_type)in_RDI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar5,in_stack_fffffffffffffee0));
      in_RDI->second = iVar1;
    }
    else {
      std::make_pair<std::__cxx11::string_const&,int>
                (&in_RDI->first,(int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                );
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (type)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x71507d);
    }
  }
  return __pos;
}

Assistant:

std::pair<std::string, int> extractInterfaceAndPort(const std::string& address)
{
    std::pair<std::string, int> ret;
    auto lastColon = address.find_last_of(':');
    if (lastColon == std::string::npos) {
        ret = std::make_pair(address, -1);
    } else {
        try {
            if ((address.size() > lastColon + 1) &&
                (address[lastColon + 1] != '/')) {
                auto val = std::stoi(address.substr(lastColon + 1));
                ret.first = address.substr(0, lastColon);
                ret.second = val;
            } else {
                ret = std::make_pair(address, -1);
            }
        }
        catch (const std::invalid_argument&) {
            ret = std::make_pair(address, -1);
        }
    }

    return ret;
}